

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall crnlib::dxt_hc::determine_tiles_task_etc(dxt_hc *this,uint64 data,void *param_2)

{
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  color_quad_u8 (*pacVar5) [16];
  double dVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  uchar uVar11;
  ulong uVar12;
  ulong uVar13;
  uint e;
  uint *puVar14;
  long lVar15;
  tile_details *this_00;
  int iVar16;
  byte *pbVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  float (*pafVar21) [8];
  uint t;
  float fVar22;
  vec2F alpha_endpoints;
  params params;
  int scan [3];
  uint total_error [3];
  int refine [4];
  results results;
  uint tile_error [5];
  color_quad_u8 tilePixels [32];
  etc1_optimizer optimizer;
  uint8 selectors [32];
  uint local_2d8;
  undefined1 local_2d0 [8];
  uint local_2c8;
  undefined2 local_2c4;
  float local_2c0;
  color_quad<unsigned_char,_int> *local_2b8;
  undefined1 local_2b0;
  undefined8 *local_2a8;
  float local_2a0;
  float fStack_29c;
  undefined1 local_298;
  long local_290;
  ulong local_288;
  ulong local_280;
  float (*local_278) [8];
  long local_270;
  tile_details *local_268;
  undefined1 local_260 [24];
  undefined8 local_248;
  undefined8 uStack_240;
  float local_238;
  float fStack_234;
  float local_228;
  undefined1 *local_220;
  vec6F local_210;
  float afStack_1f8 [8];
  color_quad<unsigned_char,_int> local_1d8 [2];
  float afStack_1d0 [2];
  float local_1c8 [2];
  float afStack_1c0 [8];
  float afStack_1a0 [8];
  float afStack_180 [8];
  undefined1 auStack_160 [8];
  etc1_optimizer local_158;
  undefined1 local_58 [40];
  
  local_158.m_sorted_luma[1].m_p = (uint *)0x0;
  local_158.m_sorted_luma[1].m_size = 0;
  local_158.m_sorted_luma[1].m_capacity = 0;
  local_158.m_sorted_luma[0].m_p = (uint *)0x0;
  local_158.m_sorted_luma[0].m_size = 0;
  local_158.m_sorted_luma[0].m_capacity = 0;
  local_158.m_luma.m_p = (unsigned_short *)0x0;
  local_158.m_luma.m_size = 0;
  local_158.m_luma.m_capacity = 0;
  local_158.m_best_solution.m_selectors.m_p = (uchar *)0x0;
  local_158.m_best_solution.m_selectors.m_size = 0;
  local_158.m_best_solution.m_selectors.m_capacity = 0;
  local_158.m_selectors.m_p = (uchar *)0x0;
  local_158.m_selectors.m_size = 0;
  local_158.m_selectors.m_capacity = 0;
  local_158.m_best_selectors.m_p = (uchar *)0x0;
  local_158.m_best_selectors.m_size._0_1_ = 0;
  local_158.m_best_selectors._9_7_ = 0;
  local_158.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r = '\0';
  local_158.m_best_solution.m_coords._1_8_ = 0;
  local_158.m_best_solution.m_error = 0xffffffffffffffff;
  local_158.m_best_solution.m_valid = false;
  local_158.m_trial_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  local_158.m_trial_solution.m_coords.m_inten_table = 0;
  local_158.m_trial_solution.m_coords.m_color4 = false;
  local_158.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
  local_158.m_trial_solution.m_selectors.m_size = 0;
  local_158.m_trial_solution.m_selectors.m_capacity = 0;
  local_158.m_trial_solution.m_error = 0xffffffffffffffff;
  local_158.m_trial_solution.m_valid = false;
  local_158.m_temp_selectors.m_p = (uchar *)0x0;
  local_158.m_temp_selectors.m_size = 0;
  local_158.m_temp_selectors.m_capacity = 0;
  local_158.m_pParams = (params *)0x0;
  local_158.m_pResult = (results *)0x0;
  local_158.m_pSorted_luma_indices = (uint32 *)0x0;
  local_158.m_pSorted_luma = (uint32 *)0x0;
  local_2c8 = 2;
  local_2c4 = 1;
  local_2c0 = 0.0;
  local_2b8 = (color_quad<unsigned_char,_int> *)0x0;
  local_2b0 = 0;
  local_2a8 = (undefined8 *)&etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_2a0 = 1.4013e-45;
  fStack_29c = 0.0;
  local_298 = 0;
  local_220 = local_58;
  local_260._0_4_ = -NAN;
  local_260._4_4_ = 0.0;
  local_260._8_4_ = 1.4013e-45;
  local_248._0_4_ = -NAN;
  local_248._4_4_ = -NAN;
  uStack_240._0_4_ = 2.8026e-45;
  uStack_240._4_4_ = 4.2039e-45;
  if ((this->m_params).m_num_levels != 0) {
    uVar8 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
    local_290 = data + 1;
    pafVar21 = this->m_color_derating;
    uVar12 = 0;
    do {
      uVar4 = (this->m_params).m_levels[uVar12].m_first_block;
      uVar13 = (ulong)(this->m_params).m_levels[uVar12].m_num_blocks;
      uVar19 = (int)((uVar13 * data) / uVar8) + uVar4 & 0xfffffffe;
      uVar20 = (ulong)uVar19;
      uVar7 = (int)((uVar13 * local_290) / uVar8) + uVar4 & 0xfffffffe;
      local_288 = uVar12;
      if (uVar19 < uVar7) {
        fVar3 = (this->m_params).m_levels[uVar12].m_weight;
        local_280 = (ulong)uVar7;
        local_278 = pafVar21;
        do {
          pafVar21 = local_278;
          uVar12 = uVar20 >> 1;
          uVar7 = 0;
          local_270 = uVar12 * 0x40;
          pacVar5 = this->m_blocks;
          uVar13 = 0;
          do {
            uVar19 = (uint)(uVar13 >> 2) & 0x3fffffff | uVar7 & 0xc;
            local_1d8[uVar13].field_0.field_0.r = pacVar5[uVar12][uVar19].field_0.field_0.r;
            local_1d8[uVar13].field_0.field_0.g = pacVar5[uVar12][uVar19].field_0.field_0.g;
            local_1d8[uVar13].field_0.field_0.b = pacVar5[uVar12][uVar19].field_0.field_0.b;
            local_1d8[uVar13].field_0.field_0.a = pacVar5[uVar12][uVar19].field_0.field_0.a;
            uVar13 = uVar13 + 1;
            uVar7 = uVar7 + 4;
          } while (uVar13 != 0x10);
          pacVar5 = this->m_blocks;
          afStack_1a0._8_8_ = *(undefined8 *)(*pacVar5 + uVar20 * 8);
          afStack_1a0._16_8_ = *(undefined8 *)(*pacVar5 + uVar20 * 8 + 2);
          afStack_1a0._24_8_ = *(undefined8 *)(*pacVar5 + uVar20 * 8 + 4);
          afStack_180._0_8_ = *(undefined8 *)(*pacVar5 + uVar20 * 8 + 4 + 2);
          paVar1 = &(*pacVar5)[uVar20 * 8 + 8].field_0;
          afStack_180[2] = *(float *)paVar1;
          afStack_180[3] = *(float *)(paVar1 + 1);
          afStack_180[4] = *(float *)(paVar1 + 2);
          afStack_180[5] = *(float *)(paVar1 + 3);
          afStack_180._24_8_ = *(undefined8 *)(*pacVar5 + uVar20 * 8 + 0xc);
          auStack_160 = *(undefined1 (*) [8])(*pacVar5 + uVar20 * 8 + 0xc + 2);
          puVar14 = &DAT_001ac1e0;
          uVar12 = 0;
          do {
            local_2c0 = (float)(8 << ((byte)(uVar12 >> 2) & 0x1f));
            local_2b8 = local_1d8 + *puVar14;
            local_228 = local_2c0;
            etc1_optimizer::init(&local_158,(EVP_PKEY_CTX *)&local_2c8);
            local_2a8 = (undefined8 *)local_260;
            local_2a0 = 4.2039e-45;
            etc1_optimizer::compute(&local_158);
            if ((ulong)(uint)((int)local_2c0 * 0x177) < CONCAT44(fStack_234,local_238)) {
              local_2a8 = &local_248;
              local_2a0 = 5.60519e-45;
              etc1_optimizer::compute(&local_158);
            }
            afStack_1f8[uVar12] = local_238;
            uVar12 = uVar12 + 1;
            puVar14 = puVar14 + 1;
          } while (uVar12 != 5);
          pbVar9 = &DAT_001ac1f4;
          uVar12 = 0;
          do {
            *(undefined4 *)(local_260 + uVar12 * 4 + 0xc) = 0;
            uVar10 = uVar12 + 1;
            iVar16 = 0;
            pbVar17 = pbVar9;
            uVar13 = uVar10 & 0xffffffff;
            do {
              iVar16 = iVar16 + (int)afStack_1f8[*pbVar17];
              pbVar17 = pbVar17 + 1;
              bVar18 = (byte)uVar13;
              uVar13 = uVar13 >> 1 & 0x7f;
            } while (1 < bVar18);
            *(int *)(local_260 + uVar12 * 4 + 0xc) = iVar16;
            pbVar9 = pbVar9 + 2;
            uVar12 = uVar10;
          } while (uVar10 != 3);
          fVar22 = 0.0;
          uVar13 = 0;
          uVar12 = 0;
          do {
            dVar6 = 999999.0;
            if (*(uint *)(local_260 + uVar13 * 4 + 0xc) != 0) {
              dVar6 = (double)*(uint *)(local_260 + uVar13 * 4 + 0xc) / 48.0;
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              dVar6 = log10(255.0 / dVar6);
              dVar6 = dVar6 * 20.0;
            }
            dVar6 = dVar6 - (double)(*pafVar21)[uVar13];
            if (dVar6 <= 0.0) {
              dVar6 = 0.0;
            }
            if (fVar22 < (float)dVar6) {
              uVar12 = uVar13 & 0xffffffff;
              fVar22 = (float)dVar6;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != 3);
          if (this->m_num_alpha_blocks == 0) {
            local_2d0 = (undefined1  [8])0x0;
          }
          else {
            palettize_alpha((dxt_hc *)local_2d0,(color_quad_u8 *)this,(uint)local_1d8,0x10);
          }
          uVar7 = (uint)uVar12 + 1;
          uVar13 = (ulong)uVar7;
          local_2d8 = (uint)uVar20;
          if (uVar7 != 0) {
            local_268 = (tile_details *)local_2d0;
            lVar15 = 0;
            do {
              this_00 = (this->m_tiles).m_p + ((uint)lVar15 | local_2d8);
              vector<crnlib::color_quad<unsigned_char,_int>_>::append
                        (&this_00->pixels,
                         local_1d8 +
                         (uint)(&DAT_001ac1e0)[(byte)(&DAT_001ac1f4)[uVar12 * 2 + lVar15]],
                         8 << ((byte)(&DAT_001ac1f4)[uVar12 * 2 + lVar15] >> 2 & 0x1f));
              this_00->weight = fVar3;
              palettize_color(&local_210,this,(this_00->pixels).m_p,(this_00->pixels).m_size);
              *(undefined8 *)((this_00->color_endpoint).m_s + 4) = local_210.m_s._16_8_;
              *(undefined8 *)(this_00->color_endpoint).m_s = local_210.m_s._0_8_;
              *(undefined8 *)((this_00->color_endpoint).m_s + 2) = local_210.m_s._8_8_;
              if (this->m_num_alpha_blocks != 0) {
                *(tile_details **)((vec<2U,_float> *)(&this_00->color_endpoint + 1))->m_s =
                     local_268;
              }
              uVar7 = (uint)uVar13;
              uVar13 = uVar13 >> 1;
              lVar15 = lVar15 + 1;
            } while (1 < uVar7);
          }
          uVar13 = 0;
          do {
            uVar10 = uVar13 | uVar20;
            (this->m_block_encodings).m_p[uVar10] = (uchar)uVar12;
            (this->m_tile_indices).m_p[uVar10] =
                 (byte)(&DAT_001ac1fa)[uVar12 * 2 + uVar13] | local_2d8;
            uVar11 = (uchar)uVar12;
            if (uVar13 == 0) {
              uVar11 = '\0';
            }
            (this->m_endpoint_indices).m_p[uVar10].reference = uVar11;
            uVar13 = uVar13 + 1;
          } while (uVar13 == 1);
          if (1 < (uint)uVar12) {
            pacVar5 = this->m_blocks;
            pfVar2 = (float *)((long)&(*pacVar5)[0xc].field_0 + local_270);
            *(undefined8 *)pfVar2 = afStack_1c0._24_8_;
            *(undefined8 *)(pfVar2 + 2) = afStack_1a0._0_8_;
            pfVar2 = (float *)((long)&(*pacVar5)[8].field_0 + local_270);
            *(undefined8 *)pfVar2 = afStack_1c0._8_8_;
            *(undefined8 *)(pfVar2 + 2) = afStack_1c0._16_8_;
            pfVar2 = (float *)((long)&(*pacVar5)[4].field_0 + local_270);
            *(float (*) [2])pfVar2 = local_1c8;
            *(undefined8 *)(pfVar2 + 2) = afStack_1c0._0_8_;
            pfVar2 = (float *)((long)&(*pacVar5)[0].field_0 + local_270);
            *(color_quad<unsigned_char,_int> (*) [2])pfVar2 = local_1d8;
            *(float (*) [2])(pfVar2 + 2) = afStack_1d0;
          }
          uVar20 = uVar20 + 2;
          pafVar21 = local_278;
        } while (uVar20 < local_280);
      }
      uVar12 = local_288 + 1;
      pafVar21 = pafVar21 + 1;
    } while (uVar12 < (this->m_params).m_num_levels);
  }
  etc1_optimizer::~etc1_optimizer(&local_158);
  return;
}

Assistant:

void dxt_hc::determine_tiles_task_etc(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint offsets[5] = { 0, 8, 16, 24, 16 };
        uint8 tiles[3][2] = { { 4 }, { 2, 3 }, { 0, 1 } };
        uint8 tile_map[3][2] = { { 0, 0 }, { 0, 1 }, { 0, 1 } };
        color_quad_u8 tilePixels[32];
        uint8 selectors[32];
        uint tile_error[5];
        uint total_error[3];

        etc1_optimizer optimizer;
        etc1_optimizer::params params;
        params.m_use_color4 = false;
        params.m_constrain_against_base_color5 = false;
        etc1_optimizer::results results;
        results.m_pSelectors = selectors;
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };

        for (uint level = 0; level < m_params.m_num_levels; level++)
        {
            float weight = m_params.m_levels[level].m_weight;
            uint b = (m_params.m_levels[level].m_first_block + m_params.m_levels[level].m_num_blocks * data / num_tasks) & ~1;
            uint bEnd = (m_params.m_levels[level].m_first_block + m_params.m_levels[level].m_num_blocks * (data + 1) / num_tasks) & ~1;
            for (; b < bEnd; b += 2)
            {
                for (uint p = 0; p < 16; p++)
                {
                    tilePixels[p] = m_blocks[b >> 1][(p << 2 & 12) | p >> 2];
                }
                memcpy(tilePixels + 16, m_blocks[b >> 1], 64);
                for (uint t = 0; t < 5; t++)
                {
                    params.m_pSrc_pixels = tilePixels + offsets[t];
                    params.m_num_src_pixels = results.m_n = 8 << (t >> 2);
                    optimizer.init(params, results);
                    params.m_pScan_deltas = scan;
                    params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                    optimizer.compute();
                    if (results.m_error > 375 * params.m_num_src_pixels)
                    {
                        params.m_pScan_deltas = refine;
                        params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                        optimizer.compute();
                    }
                    tile_error[t] = results.m_error;
                }

                for (uint8 e = 0; e < 3; e++)
                {
                    total_error[e] = 0;
                    for (uint8 t = 0, s = e + 1; s; s >>= 1, t++)
                    {
                        total_error[e] += tile_error[tiles[e][t]];
                    }
                }

                float best_quality = 0.0f;
                uint best_encoding = 0;
                for (uint e = 0; e < 3; e++)
                {
                    float quality = 0;
                    double peakSNR = total_error[e] ? log10(255.0f / sqrt(total_error[e] / 48.0)) * 20.0f : 999999.0f;
                    quality = (float)math::maximum<double>(peakSNR - m_color_derating[level][e], 0.0f);
                    if (quality > best_quality)
                    {
                        best_quality = quality;
                        best_encoding = e;
                    }
                }

                vec2F alpha_endpoints = m_num_alpha_blocks ? palettize_alpha(tilePixels, 16, 3) : vec2F(cClear);
                for (uint tile_index = 0, s = best_encoding + 1; s; s >>= 1, tile_index++)
                {
                    tile_details& tile = m_tiles[b | tile_index];
                    uint t = tiles[best_encoding][tile_index];
                    tile.pixels.append(tilePixels + offsets[t], 8 << (t >> 2));
                    tile.weight = weight;
                    tile.color_endpoint = palettize_color(tile.pixels.get_ptr(), tile.pixels.size());
                    if (m_num_alpha_blocks)
                    {
                        tile.alpha_endpoints[0] = alpha_endpoints;
                    }
                }

                for (uint bx = 0; bx < 2; bx++)
                {
                    m_block_encodings[b | bx] = best_encoding;
                    m_tile_indices[b | bx] = b | tile_map[best_encoding][bx];
                    m_endpoint_indices[b | bx].reference = bx ? best_encoding : 0;
                }
                if (best_encoding >> 1)
                {
                    memcpy(m_blocks[b >> 1], tilePixels, 64);
                }
            }
        }
    }